

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,DefinitionSymbol *args,
          SourceRange *args_1)

{
  undefined8 *puVar1;
  SourceLocation *pSVar2;
  undefined8 *puVar3;
  size_type sVar4;
  ulong uVar5;
  pointer p;
  SourceLocation SVar6;
  SourceLocation SVar7;
  DefinitionSymbol *pDVar8;
  ConfigRule *pCVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  pointer pTVar13;
  pointer pTVar14;
  pointer pTVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  pointer __src;
  long lVar19;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    SVar6 = args_1->startLoc;
    SVar7 = args_1->endLoc;
    __src->definition = args;
    __src->rule = (ConfigRule *)0x0;
    (__src->sourceRange).startLoc = SVar6;
    (__src->sourceRange).endLoc = SVar7;
    sVar4 = this->len;
    this->len = sVar4 + 1;
    return this->data_ + sVar4;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar18 = this->len + 1;
  uVar5 = this->cap;
  if (uVar18 < uVar5 * 2) {
    uVar18 = uVar5 * 2;
  }
  if (0x3ffffffffffffff - uVar5 < uVar5) {
    uVar18 = 0x3ffffffffffffff;
  }
  lVar19 = (long)__src - (long)this->data_;
  pTVar15 = (pointer)operator_new(uVar18 << 5);
  *(DefinitionSymbol **)((long)pTVar15 + lVar19) = args;
  *(undefined8 *)((long)pTVar15 + lVar19 + 8) = 0;
  SVar6 = args_1->endLoc;
  pSVar2 = (SourceLocation *)((long)pTVar15 + lVar19 + 0x10);
  *pSVar2 = args_1->startLoc;
  pSVar2[1] = SVar6;
  p = this->data_;
  lVar16 = this->len * 0x20;
  lVar17 = (long)p + (lVar16 - (long)__src);
  pTVar13 = p;
  pTVar14 = pTVar15;
  if (lVar17 == 0) {
    if (this->len != 0) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->definition + lVar17);
        uVar10 = *puVar1;
        uVar11 = puVar1[1];
        puVar1 = (undefined8 *)(&(p->sourceRange).startLoc.field_0x0 + lVar17);
        uVar12 = puVar1[1];
        puVar3 = (undefined8 *)(&(pTVar15->sourceRange).startLoc.field_0x0 + lVar17);
        *puVar3 = *puVar1;
        puVar3[1] = uVar12;
        puVar1 = (undefined8 *)((long)&pTVar15->definition + lVar17);
        *puVar1 = uVar10;
        puVar1[1] = uVar11;
        lVar17 = lVar17 + 0x20;
      } while (lVar16 != lVar17);
    }
  }
  else {
    for (; pTVar13 != __src; pTVar13 = pTVar13 + 1) {
      pDVar8 = pTVar13->definition;
      pCVar9 = pTVar13->rule;
      SVar6 = (pTVar13->sourceRange).endLoc;
      (pTVar14->sourceRange).startLoc = (pTVar13->sourceRange).startLoc;
      (pTVar14->sourceRange).endLoc = SVar6;
      pTVar14->definition = pDVar8;
      pTVar14->rule = pCVar9;
      pTVar14 = pTVar14 + 1;
    }
    memcpy((void *)((long)pTVar15 + lVar19 + 0x20),__src,
           (lVar17 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar18;
  this->data_ = pTVar15;
  return (reference)((long)pTVar15 + lVar19);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }